

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XPathScannerForSchema::addToken
          (XPathScannerForSchema *this,ValueVectorOf<int> *tokens,int aToken)

{
  XPathException *this_00;
  MemoryManager *memoryManager;
  int local_1c;
  ValueVectorOf<int> *pVStack_18;
  int aToken_local;
  ValueVectorOf<int> *tokens_local;
  XPathScannerForSchema *this_local;
  
  local_1c = aToken;
  pVStack_18 = tokens;
  tokens_local = (ValueVectorOf<int> *)this;
  if ((((((aToken != 6) && (aToken != 0x23)) && (aToken != 0x24)) &&
       ((aToken != 8 && (aToken != 0xb)))) && ((aToken != 0x15 && ((aToken != 4 && (aToken != 9)))))
      ) && ((aToken != 10 && ((aToken != 0x16 && (aToken != 0x17)))))) {
    this_00 = (XPathException *)__cxa_allocate_exception(0x30);
    memoryManager = ValueVectorOf<int>::getMemoryManager(pVStack_18);
    XPathException::XPathException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
               ,0x5ad,XPath_TokenNotSupported,memoryManager);
    __cxa_throw(this_00,&XPathException::typeinfo,XPathException::~XPathException);
  }
  ValueVectorOf<int>::addElement(tokens,&local_1c);
  return;
}

Assistant:

void XPathScannerForSchema::addToken(ValueVectorOf<int>* const tokens,
                                     const int aToken) {

    if (aToken == XercesXPath::EXPRTOKEN_ATSIGN ||
        aToken == XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE ||
        aToken == XercesXPath::EXPRTOKEN_AXISNAME_CHILD ||
        //token == XercesXPath::EXPRTOKEN_AXISNAME_SELF ||
        aToken == XercesXPath::EXPRTOKEN_DOUBLE_COLON ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_QNAME ||
        //token == XercesXPath::EXPRTOKEN_NODETYPE_NODE ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH ||
        aToken == XercesXPath::EXPRTOKEN_PERIOD ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_ANY ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_UNION) {

        tokens->addElement(aToken);
        return;
    }

    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_TokenNotSupported, tokens->getMemoryManager());
}